

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O1

UINTN GetInfo(void *Source,UINT32 SourceSize,UINT32 *DestinationSize,UINT32 *ScratchSize)

{
  UINTN UVar1;
  
  UVar1 = 1;
  if ((((7 < SourceSize) && (Source != (void *)0x0)) && (DestinationSize != (UINT32 *)0x0)) &&
     ((ScratchSize != (UINT32 *)0x0 && (*Source < 0xfffffff8 && *Source + 8 <= SourceSize)))) {
    *ScratchSize = 0x3440;
    *DestinationSize = *(UINT32 *)((long)Source + 4);
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

EFI_STATUS
EFIAPI
GetInfo (
    IN  CONST VOID  *Source,
    IN  UINT32      SourceSize,
    OUT UINT32      *DestinationSize,
    OUT UINT32      *ScratchSize
    )
{
    UINT32  CompressedSize;

    if (Source == NULL || DestinationSize == NULL || ScratchSize == NULL || SourceSize < 8) {
        return EFI_INVALID_PARAMETER;
    }

    CompressedSize = *(UINT32 *)Source;
    if (SourceSize < (CompressedSize + 8) || (CompressedSize + 8) < 8) {
        return EFI_INVALID_PARAMETER;
    }

    *ScratchSize = sizeof(SCRATCH_DATA);
    *DestinationSize = *((UINT32 *)Source + 1);

    return EFI_SUCCESS;
}